

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# term.hh
# Opt level: O2

bool OB::Term::ANSI_Escape_Codes::valid_hstr(string *str_)

{
  bool bVar1;
  ostream *poVar2;
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  stringstream local_230 [8];
  stringstream ss;
  ostream local_220 [376];
  string local_a8 [32];
  undefined1 local_88 [8];
  regex rx;
  smatch m;
  undefined1 local_40 [8];
  string hstr;
  
  rx._M_automaton.
  super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_88,
             "^#?((?:[0-9a-fA-F]{3}){1,2})$",0x10);
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                    (str_,(match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)&rx._M_automaton.
                              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount,
                     (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_88,0x20);
  if (bVar1) {
    if ((-(long)rx._M_automaton.
                super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi == 0) ||
       (0xfffffffffffffffd <
        -(long)rx._M_automaton.
               super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi / 0x18 - 5U)) {
      this = (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0xffffffffffffffb8;
    }
    else {
      this = (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&rx._M_automaton.
                 super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi[1]._M_use_count;
    }
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str((string_type *)local_40,this);
    if (hstr._M_dataplus._M_p == (pointer)0x3) {
      std::__cxx11::stringstream::stringstream(local_230);
      poVar2 = std::operator<<(local_220,*(char *)local_40);
      poVar2 = std::operator<<(poVar2,*(char *)local_40);
      poVar2 = std::operator<<(poVar2,*(char *)((long)local_40 + 1));
      poVar2 = std::operator<<(poVar2,*(char *)((long)local_40 + 1));
      poVar2 = std::operator<<(poVar2,*(char *)((long)local_40 + 2));
      std::operator<<(poVar2,*(char *)((long)local_40 + 2));
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)local_40,local_a8);
      std::__cxx11::string::~string(local_a8);
      std::__cxx11::stringstream::~stringstream(local_230);
    }
    std::__cxx11::string::_M_assign((string *)str_);
    std::__cxx11::string::~string((string *)local_40);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_88);
  std::
  _Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)&rx._M_automaton.
                      super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
  return bVar1;
}

Assistant:

inline bool valid_hstr(std::string& str_)
{
  std::smatch m;
  std::regex rx {"^#?((?:[0-9a-fA-F]{3}){1,2})$"};

  if (std::regex_match(str_, m, rx, std::regex_constants::match_not_null))
  {
    std::string hstr {m[1]};

    if (hstr.size() == 3)
    {
      std::stringstream ss;
      ss << hstr[0] << hstr[0] << hstr[1] << hstr[1] << hstr[2] << hstr[2];
      hstr = ss.str();
    }

    str_ = hstr;

    return true;
  }

  return false;
}